

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * re2::SimplifyWalker::SimplifyRepeat(Regexp *re,int min,int max,ParseFlags f)

{
  uint uVar1;
  Regexp *pRVar2;
  Regexp *re1;
  Regexp *re1_00;
  ostream *poVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  string local_1d0;
  PODArray<re2::Regexp_*> nre_subs;
  
  if (max == -1) {
    if (min == 1) {
      pRVar2 = Regexp::Incref(re);
      pRVar2 = Regexp::Plus(pRVar2,f);
      return pRVar2;
    }
    if (min == 0) {
      pRVar2 = Regexp::Incref(re);
      pRVar2 = Regexp::Star(pRVar2,f);
      return pRVar2;
    }
    PODArray<re2::Regexp_*>::PODArray(&nre_subs,min);
    uVar1 = min - 1;
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      pRVar2 = Regexp::Incref(re);
      nre_subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
      ._M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
      super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[uVar5] = pRVar2;
    }
    pRVar2 = Regexp::Incref(re);
    pRVar2 = Regexp::Plus(pRVar2,f);
    nre_subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
    _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
    super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[(int)uVar1] = pRVar2;
    pRVar2 = Regexp::Concat(nre_subs.ptr_._M_t.
                            super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                            .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl,min,f);
    std::unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter>::~unique_ptr
              (&nre_subs.ptr_);
  }
  else if (max == 0 && min == 0) {
    pRVar2 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar2,kRegexpEmptyMatch,f);
  }
  else {
    if (max == 1 && min == 1) {
      pRVar2 = Regexp::Incref(re);
      return pRVar2;
    }
    if (min < 1) {
      re1 = (Regexp *)0x0;
    }
    else {
      PODArray<re2::Regexp_*>::PODArray(&nre_subs,min);
      for (uVar5 = 0; (uint)min != uVar5; uVar5 = uVar5 + 1) {
        pRVar2 = Regexp::Incref(re);
        nre_subs.ptr_._M_t.
        super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
        super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[uVar5] = pRVar2;
      }
      re1 = Regexp::Concat(nre_subs.ptr_._M_t.
                           super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                           .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl,min,f);
      std::unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter>::~unique_ptr
                (&nre_subs.ptr_);
    }
    pRVar2 = re1;
    if (min < max) {
      pRVar2 = Regexp::Incref(re);
      pRVar2 = Regexp::Quest(pRVar2,f);
      for (iVar4 = min + 1; iVar4 < max; iVar4 = iVar4 + 1) {
        re1_00 = Regexp::Incref(re);
        pRVar2 = Concat2(re1_00,pRVar2,f);
        pRVar2 = Regexp::Quest(pRVar2,f);
      }
      if (re1 != (Regexp *)0x0) {
        pRVar2 = Concat2(re1,pRVar2,f);
        return pRVar2;
      }
    }
    if (pRVar2 == (Regexp *)0x0) {
      LogMessage::LogMessage
                ((LogMessage *)&nre_subs,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/simplify.cc"
                 ,0x27a);
      poVar3 = std::operator<<((ostream *)
                               &nre_subs.ptr_._M_t.
                                super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                                .super__Head_base<0UL,_re2::Regexp_**,_false>,"Malformed repeat ");
      Regexp::ToString_abi_cxx11_(&local_1d0,re);
      poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,min);
      poVar3 = std::operator<<(poVar3," ");
      std::ostream::operator<<(poVar3,max);
      std::__cxx11::string::~string((string *)&local_1d0);
      LogMessage::~LogMessage((LogMessage *)&nre_subs);
      pRVar2 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar2,kRegexpNoMatch,f);
    }
  }
  return pRVar2;
}

Assistant:

Regexp* SimplifyWalker::SimplifyRepeat(Regexp* re, int min, int max,
                                       Regexp::ParseFlags f) {
  // x{n,} means at least n matches of x.
  if (max == -1) {
    // Special case: x{0,} is x*
    if (min == 0)
      return Regexp::Star(re->Incref(), f);

    // Special case: x{1,} is x+
    if (min == 1)
      return Regexp::Plus(re->Incref(), f);

    // General case: x{4,} is xxxx+
    PODArray<Regexp*> nre_subs(min);
    for (int i = 0; i < min-1; i++)
      nre_subs[i] = re->Incref();
    nre_subs[min-1] = Regexp::Plus(re->Incref(), f);
    return Regexp::Concat(nre_subs.data(), min, f);
  }

  // Special case: (x){0} matches only empty string.
  if (min == 0 && max == 0)
    return new Regexp(kRegexpEmptyMatch, f);

  // Special case: x{1} is just x.
  if (min == 1 && max == 1)
    return re->Incref();

  // General case: x{n,m} means n copies of x and m copies of x?.
  // The machine will do less work if we nest the final m copies,
  // so that x{2,5} = xx(x(x(x)?)?)?

  // Build leading prefix: xx.  Capturing only on the last one.
  Regexp* nre = NULL;
  if (min > 0) {
    PODArray<Regexp*> nre_subs(min);
    for (int i = 0; i < min; i++)
      nre_subs[i] = re->Incref();
    nre = Regexp::Concat(nre_subs.data(), min, f);
  }

  // Build and attach suffix: (x(x(x)?)?)?
  if (max > min) {
    Regexp* suf = Regexp::Quest(re->Incref(), f);
    for (int i = min+1; i < max; i++)
      suf = Regexp::Quest(Concat2(re->Incref(), suf, f), f);
    if (nre == NULL)
      nre = suf;
    else
      nre = Concat2(nre, suf, f);
  }

  if (nre == NULL) {
    // Some degenerate case, like min > max, or min < max < 0.
    // This shouldn't happen, because the parser rejects such regexps.
    LOG(DFATAL) << "Malformed repeat " << re->ToString() << " " << min << " " << max;
    return new Regexp(kRegexpNoMatch, f);
  }

  return nre;
}